

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

void find_best_non_dual_interp_filter
               (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,
               BUFFER_SET *orig_dst,int64_t *rd,RD_STATS *rd_stats_y,RD_STATS *rd_stats,
               int *switchable_rate,BUFFER_SET **dst_bufs,int *switchable_ctx,int skip_ver,
               int skip_hor)

{
  byte bVar1;
  INTERP_PRED_TYPE IVar2;
  uint8_t uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int_interpfilters iVar7;
  uint uVar8;
  byte in_CL;
  BUFFER_SET *in_RDX;
  AV1_COMP *unaff_RBX;
  long *in_RSI;
  TileDataEnc *in_RDI;
  RD_STATS *in_R8;
  RD_STATS *in_R9;
  MACROBLOCK *unaff_R12;
  RD_STATS *unaff_retaddr;
  RD_STATS *in_stack_00000008;
  int *in_stack_00000010;
  BUFFER_SET **in_stack_00000018;
  int in_stack_00000020;
  int *in_stack_00000028;
  uint in_stack_00000030;
  uint in_stack_00000038;
  int skip_pred_1;
  uint16_t allowed_interp_mask;
  int skip_pred;
  int filter_idx;
  int_interpfilters lf;
  int_interpfilters af;
  INTERP_PRED_TYPE pred_filter_type;
  DUAL_FILTER_TYPE filt_type;
  int thresh;
  int *switchable_interp_p1;
  int *switchable_interp_p0;
  int use_actual_frame_probs;
  int ctx1;
  int ctx0;
  FRAME_UPDATE_TYPE update_type;
  uint16_t interp_filter_search_mask;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int8_t i;
  InterpSearchFlags *interp_search_flags;
  undefined8 in_stack_ffffffffffffff28;
  MACROBLOCKD *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int_interpfilters *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff54;
  undefined1 uVar9;
  BLOCK_SIZE in_stack_ffffffffffffff57;
  undefined1 uVar10;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  BLOCK_SIZE in_stack_ffffffffffffff67;
  undefined2 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6a;
  DUAL_FILTER_TYPE in_stack_ffffffffffffff6b;
  int in_stack_ffffffffffffff6c;
  AV1_COMP *in_stack_ffffffffffffff70;
  MACROBLOCK *in_stack_ffffffffffffff78;
  uint16_t local_72;
  long local_70;
  aom_cdf_prob (*local_68) [3];
  DUAL_FILTER_TYPE local_59;
  uint *local_58;
  undefined7 in_stack_ffffffffffffffc0;
  uint16_t allow_interp_mask;
  
  local_58 = (uint *)(in_RSI + 0x13a5e);
  local_68 = (in_RDI->tctx).txb_skip_cdf[4] + 0xc;
  local_70 = **(long **)((in_RDI->tctx).inter_compound_mode_cdf[3] + 1);
  local_72 = *(uint16_t *)((long)in_RSI + 0x9d2f4);
  iVar6 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if (*(int *)((long)in_RSI + 0x60b54) == 2) {
    bVar1 = get_frame_update_type((GF_GROUP *)(*in_RSI + 400),(uint)*(byte *)(in_RSI + 0xe258));
    iVar5 = av1_get_pred_context_switchable_interp(in_stack_ffffffffffffff30,iVar6);
    iVar6 = av1_get_pred_context_switchable_interp(in_stack_ffffffffffffff30,iVar6);
    in_stack_ffffffffffffff78 =
         (MACROBLOCK *)(*in_RSI + 0x1480c + (ulong)bVar1 * 0xc0 + (long)iVar5 * 0xc);
    in_stack_ffffffffffffff70 =
         (AV1_COMP *)(*in_RSI + 0x1480c + (ulong)bVar1 * 0xc0 + (long)iVar6 * 0xc);
    in_stack_ffffffffffffff6c = find_best_non_dual_interp_filter::thr[bVar1];
    for (local_59 = '\0'; (char)local_59 < '\x03'; local_59 = local_59 + '\x01') {
      if ((*(int *)((long)&in_stack_ffffffffffffff78->plane[0].src_diff + (long)(char)local_59 * 4)
           < in_stack_ffffffffffffff6c) &&
         (*(int *)((long)((in_stack_ffffffffffffff70->enc_quant_dequant_params).quants.y_quant + -1)
                  + (long)(char)local_59 * 4) < in_stack_ffffffffffffff6c)) {
        in_stack_ffffffffffffff6b = local_59 * '\x04';
        reset_interp_filter_allowed_mask(&local_72,in_stack_ffffffffffffff6b);
      }
    }
  }
  if ((in_stack_00000038 & in_stack_00000030) != *local_58) {
    iVar7 = av1_broadcast_interp_filter(INTERP_INVALID);
    uVar9 = (undefined1)((uint)iVar7 >> 0x10);
    in_stack_ffffffffffffff67 = (BLOCK_SIZE)((uint)iVar7 >> 0x18);
    IVar2 = is_pred_filter_search_allowed
                      ((AV1_COMP *)
                       CONCAT17(in_stack_ffffffffffffff67,
                                CONCAT16(uVar9,CONCAT24(iVar7.as_filters.y_filter,iVar7.as_int))),
                       (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       in_stack_ffffffffffffff57,in_stack_ffffffffffffff48,
                       (int_interpfilters *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (IVar2 != '\0') {
      iVar6 = (uint)CONCAT11(in_stack_ffffffffffffff67,uVar9) << 2;
      if ((*(int *)((long)in_RSI + 0x60b54) != 0) &&
         (uVar3 = get_interp_filter_allowed_mask(local_72,(DUAL_FILTER_TYPE)iVar6), uVar3 == '\0'))
      {
        return;
      }
      if (iVar6 == 0) {
        return;
      }
      interpolation_filter_rd
                (unaff_R12,unaff_RBX,in_RDI,(BLOCK_SIZE)((ulong)in_RSI >> 0x38),in_RDX,
                 (int64_t *)CONCAT17(in_CL,in_stack_ffffffffffffffc0),unaff_retaddr,
                 in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
                 in_stack_00000028,in_stack_00000030);
      return;
    }
    in_stack_ffffffffffffff6a = 0;
  }
  if (((in_CL == 0) || ((block_size_wide[in_CL] == '\x04' && (in_stack_00000030 == *local_58)))) ||
     ((block_size_high[in_CL] == '\x04' && (in_stack_00000038 == *local_58)))) {
    uVar8 = in_stack_00000038 & in_stack_00000030;
    uVar9 = 0;
    uVar10 = 0;
    set_interp_filter_allowed_mask((uint16_t *)&stack0xffffffffffffff56,'\b');
    iVar5 = (int)unaff_R12;
    allow_interp_mask = (uint16_t)unaff_RBX;
    iVar6 = (int)in_RDI;
    set_interp_filter_allowed_mask((uint16_t *)&stack0xffffffffffffff56,'\x04');
    if (*(int *)((long)in_RSI + 0x60b54) != 0) {
      uVar4 = CONCAT11(uVar10,uVar9) & local_72;
      uVar9 = (undefined1)uVar4;
      uVar10 = (undefined1)(uVar4 >> 8);
    }
    find_best_interp_rd_facade
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               (TileDataEnc *)
               CONCAT44(in_stack_ffffffffffffff6c,
                        CONCAT13(in_stack_ffffffffffffff6b,
                                 CONCAT12(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68))),
               in_stack_ffffffffffffff67,(BUFFER_SET *)CONCAT44(in_stack_ffffffffffffff5c,uVar8),
               (int64_t *)
               CONCAT17(uVar10,CONCAT16(uVar9,CONCAT24(in_stack_ffffffffffffff54,
                                                       in_stack_ffffffffffffff50))),in_R9,in_R8,
               (int *)CONCAT17(in_CL,in_stack_ffffffffffffffc0),(BUFFER_SET **)in_RDX,(int *)in_RSI,
               iVar6,allow_interp_mask,iVar5);
  }
  else {
    uVar8 = in_stack_00000038 & in_stack_00000030;
    local_59 = '\x04';
    while (((char)local_59 < '\t' &&
           ((((*(int *)((long)in_RSI + 0x60b54) != 0 &&
              (uVar3 = get_interp_filter_allowed_mask(local_72,local_59), uVar3 == '\0')) ||
             (interpolation_filter_rd
                        (unaff_R12,unaff_RBX,in_RDI,(BLOCK_SIZE)((ulong)in_RSI >> 0x38),in_RDX,
                         (int64_t *)CONCAT17(in_CL,in_stack_ffffffffffffffc0),unaff_retaddr,
                         in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
                         in_stack_00000028,in_stack_00000030), *(int *)((long)in_RSI + 0x60b4c) == 0
             )) || ((uVar8 == *local_58 || (*(int *)(local_70 + 0x14) != 0x10001))))))) {
      local_59 = local_59 + '\x04';
    }
  }
  return;
}

Assistant:

static inline void find_best_non_dual_interp_filter(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const orig_dst, int64_t *const rd, RD_STATS *rd_stats_y,
    RD_STATS *rd_stats, int *const switchable_rate,
    const BUFFER_SET *dst_bufs[2], const int switchable_ctx[2],
    const int skip_ver, const int skip_hor) {
  const InterpSearchFlags *interp_search_flags = &cpi->interp_search_flags;
  int8_t i;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];

  uint16_t interp_filter_search_mask =
      interp_search_flags->interp_filter_search_mask;

  if (cpi->sf.interp_sf.adaptive_interp_filter_search == 2) {
    const FRAME_UPDATE_TYPE update_type =
        get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
    const int ctx0 = av1_get_pred_context_switchable_interp(xd, 0);
    const int ctx1 = av1_get_pred_context_switchable_interp(xd, 1);
    int use_actual_frame_probs = 1;
    const int *switchable_interp_p0;
    const int *switchable_interp_p1;
#if CONFIG_FPMT_TEST
    use_actual_frame_probs =
        (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 0 : 1;
    if (!use_actual_frame_probs) {
      switchable_interp_p0 = (int *)cpi->ppi->temp_frame_probs
                                 .switchable_interp_probs[update_type][ctx0];
      switchable_interp_p1 = (int *)cpi->ppi->temp_frame_probs
                                 .switchable_interp_probs[update_type][ctx1];
    }
#endif
    if (use_actual_frame_probs) {
      switchable_interp_p0 =
          cpi->ppi->frame_probs.switchable_interp_probs[update_type][ctx0];
      switchable_interp_p1 =
          cpi->ppi->frame_probs.switchable_interp_probs[update_type][ctx1];
    }
    static const int thr[7] = { 0, 8, 8, 8, 8, 0, 8 };
    const int thresh = thr[update_type];
    for (i = 0; i < SWITCHABLE_FILTERS; i++) {
      // For non-dual case, the 2 dir's prob should be identical.
      assert(switchable_interp_p0[i] == switchable_interp_p1[i]);
      if (switchable_interp_p0[i] < thresh &&
          switchable_interp_p1[i] < thresh) {
        DUAL_FILTER_TYPE filt_type = i + SWITCHABLE_FILTERS * i;
        reset_interp_filter_allowed_mask(&interp_filter_search_mask, filt_type);
      }
    }
  }

  // Regular filter evaluation should have been done and hence the same should
  // be the winner
  assert(x->e_mbd.mi[0]->interp_filters.as_int == filter_sets[0].as_int);
  if ((skip_hor & skip_ver) != interp_search_flags->default_interp_skip_flags) {
    INTERP_PRED_TYPE pred_filter_type = INTERP_HORZ_NEQ_VERT_NEQ;
    int_interpfilters af = av1_broadcast_interp_filter(INTERP_INVALID);
    int_interpfilters lf = af;

    pred_filter_type = is_pred_filter_search_allowed(cpi, xd, bsize, &af, &lf);
    if (pred_filter_type) {
      assert(af.as_filters.x_filter != INTERP_INVALID);
      int filter_idx = SWITCHABLE * af.as_filters.x_filter;
      // This assert tells that (filter_x == filter_y) for non-dual filter case
      assert(filter_sets[filter_idx].as_filters.x_filter ==
             filter_sets[filter_idx].as_filters.y_filter);
      if (cpi->sf.interp_sf.adaptive_interp_filter_search &&
          !(get_interp_filter_allowed_mask(interp_filter_search_mask,
                                           filter_idx))) {
        return;
      }
      if (filter_idx) {
        interpolation_filter_rd(x, cpi, tile_data, bsize, orig_dst, rd,
                                rd_stats_y, rd_stats, switchable_rate, dst_bufs,
                                filter_idx, switchable_ctx,
                                (skip_hor & skip_ver));
      }
      return;
    }
  }
  // Reuse regular filter's modeled rd data for sharp filter for following
  // cases
  // 1) When bsize is 4x4
  // 2) When block width is 4 (i.e. 4x8/4x16 blocks) and MV in vertical
  // direction is full-pel
  // 3) When block height is 4 (i.e. 8x4/16x4 blocks) and MV in horizontal
  // direction is full-pel
  // TODO(any): Optimize cases 2 and 3 further if luma MV in relavant direction
  // alone is full-pel

  if ((bsize == BLOCK_4X4) ||
      (block_size_wide[bsize] == 4 &&
       skip_ver == interp_search_flags->default_interp_skip_flags) ||
      (block_size_high[bsize] == 4 &&
       skip_hor == interp_search_flags->default_interp_skip_flags)) {
    int skip_pred = skip_hor & skip_ver;
    uint16_t allowed_interp_mask = 0;

    // REG_REG filter type is evaluated beforehand, hence skip it
    set_interp_filter_allowed_mask(&allowed_interp_mask, SHARP_SHARP);
    set_interp_filter_allowed_mask(&allowed_interp_mask, SMOOTH_SMOOTH);
    if (cpi->sf.interp_sf.adaptive_interp_filter_search)
      allowed_interp_mask &= interp_filter_search_mask;

    find_best_interp_rd_facade(x, cpi, tile_data, bsize, orig_dst, rd,
                               rd_stats_y, rd_stats, switchable_rate, dst_bufs,
                               switchable_ctx, skip_pred, allowed_interp_mask,
                               1);
  } else {
    int skip_pred = (skip_hor & skip_ver);
    for (i = (SWITCHABLE_FILTERS + 1); i < DUAL_FILTER_SET_SIZE;
         i += (SWITCHABLE_FILTERS + 1)) {
      // This assert tells that (filter_x == filter_y) for non-dual filter case
      assert(filter_sets[i].as_filters.x_filter ==
             filter_sets[i].as_filters.y_filter);
      if (cpi->sf.interp_sf.adaptive_interp_filter_search &&
          !(get_interp_filter_allowed_mask(interp_filter_search_mask, i))) {
        continue;
      }
      interpolation_filter_rd(x, cpi, tile_data, bsize, orig_dst, rd,
                              rd_stats_y, rd_stats, switchable_rate, dst_bufs,
                              i, switchable_ctx, skip_pred);
      // In first iteration, smooth filter is evaluated. If smooth filter
      // (which is less sharper) is the winner among regular and smooth filters,
      // sharp filter evaluation is skipped
      // TODO(any): Refine this gating based on modelled rd only (i.e., by not
      // accounting switchable filter rate)
      if (cpi->sf.interp_sf.skip_sharp_interp_filter_search &&
          skip_pred != interp_search_flags->default_interp_skip_flags) {
        if (mbmi->interp_filters.as_int == filter_sets[SMOOTH_SMOOTH].as_int)
          break;
      }
    }
  }
}